

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CombinedGeometryUniformLimitCase::iterate
          (CombinedGeometryUniformLimitCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  undefined8 uVar10;
  ScopedLogSection section;
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  ResultCollector result;
  ScopedLogSection local_2d0;
  long local_2c8;
  TestLog local_2c0;
  long lStack_2b8;
  string local_2b0;
  string local_290;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  CallLogWrapper local_250;
  StateQueryMemoryWriteGuard<int> local_234;
  StateQueryMemoryWriteGuard<int> local_228;
  StateQueryMemoryWriteGuard<int> local_21c;
  ResultCollector local_210;
  code *local_1c0;
  GLenum local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  iVar3 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_250,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_210,pTVar1,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_250.m_enableLog = true;
  local_1b0 = (undefined1  [8])
              ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "The minimum value of MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS is MAX_GEOMETRY_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_GEOMETRY_UNIFORM_COMPONENTS"
             ,0x9b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_21c.m_preguard = -0x21212122;
  local_21c.m_value = -0x21212122;
  local_21c.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_250,0x8a2c,&local_21c.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&local_250);
  if (GVar4 != 0) {
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Got Error ","");
    local_1c0 = glu::getErrorName;
    local_1b8 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_1c0);
    uVar9 = 0xf;
    if (local_270 != local_260) {
      uVar9 = local_260[0];
    }
    if (uVar9 < local_290._M_string_length + local_268) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar10 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_290._M_string_length + local_268) goto LAB_013dbb00;
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_290,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_013dbb00:
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_270,(ulong)local_290._M_dataplus._M_p);
    }
    local_2d0.m_log = &local_2c0;
    pTVar1 = (TestLog *)(plVar6 + 2);
    if ((TestLog *)*plVar6 == pTVar1) {
      local_2c0.m_log = pTVar1->m_log;
      lStack_2b8 = plVar6[3];
    }
    else {
      local_2c0.m_log = pTVar1->m_log;
      local_2d0.m_log = (TestLog *)*plVar6;
    }
    local_2c8 = plVar6[1];
    *plVar6 = (long)pTVar1;
    plVar6[1] = 0;
    *(undefined1 *)&pTVar1->m_log = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2b0.field_2._M_allocated_capacity = *psVar7;
      local_2b0.field_2._8_8_ = plVar6[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar7;
      local_2b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar6[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar6;
    }
    local_1a8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_210,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_2d0.m_log != &local_2c0) {
      operator_delete(local_2d0.m_log,(ulong)((long)&(local_2c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
  }
  local_228.m_preguard = -0x21212122;
  local_228.m_value = -0x21212122;
  local_228.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_250,0x8a30,&local_228.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&local_250);
  if (GVar4 != 0) {
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Got Error ","");
    local_1c0 = glu::getErrorName;
    local_1b8 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_1c0);
    uVar9 = 0xf;
    if (local_270 != local_260) {
      uVar9 = local_260[0];
    }
    if (uVar9 < local_290._M_string_length + local_268) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar10 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_290._M_string_length + local_268) goto LAB_013dbd6b;
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_290,0,(char *)0x0,(ulong)local_270);
    }
    else {
LAB_013dbd6b:
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_270,(ulong)local_290._M_dataplus._M_p);
    }
    local_2d0.m_log = &local_2c0;
    pTVar1 = (TestLog *)(plVar6 + 2);
    if ((TestLog *)*plVar6 == pTVar1) {
      local_2c0.m_log = pTVar1->m_log;
      lStack_2b8 = plVar6[3];
    }
    else {
      local_2c0.m_log = pTVar1->m_log;
      local_2d0.m_log = (TestLog *)*plVar6;
    }
    local_2c8 = plVar6[1];
    *plVar6 = (long)pTVar1;
    plVar6[1] = 0;
    *(undefined1 *)&pTVar1->m_log = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2b0.field_2._M_allocated_capacity = *psVar7;
      local_2b0.field_2._8_8_ = plVar6[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar7;
      local_2b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_2b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1a0[0]._8_8_ = plVar6[3];
      local_1b0 = (undefined1  [8])local_1a0;
    }
    else {
      local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1b0 = (undefined1  [8])*plVar6;
    }
    local_1a8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_210,(string *)local_1b0);
    if (local_1b0 != (undefined1  [8])local_1a0) {
      operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_2d0.m_log != &local_2c0) {
      operator_delete(local_2d0.m_log,(ulong)((long)&(local_2c0.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (local_270 != local_260) {
      operator_delete(local_270,local_260[0] + 1);
    }
  }
  local_234.m_preguard = -0x21212122;
  local_234.m_value = -0x21212122;
  local_234.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv(&local_250,0x8ddf,&local_234.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&local_250);
  if (GVar4 == 0) goto LAB_013dc17f;
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Got Error ","");
  local_1c0 = glu::getErrorName;
  local_1b8 = GVar4;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_290,&local_1c0);
  uVar9 = 0xf;
  if (local_270 != local_260) {
    uVar9 = local_260[0];
  }
  if (uVar9 < local_290._M_string_length + local_268) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      uVar10 = local_290.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_290._M_string_length + local_268) goto LAB_013dbfd5;
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_270)
    ;
  }
  else {
LAB_013dbfd5:
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_270,(ulong)local_290._M_dataplus._M_p);
  }
  local_2d0.m_log = &local_2c0;
  pTVar1 = (TestLog *)(plVar6 + 2);
  if ((TestLog *)*plVar6 == pTVar1) {
    local_2c0.m_log = pTVar1->m_log;
    lStack_2b8 = plVar6[3];
  }
  else {
    local_2c0.m_log = pTVar1->m_log;
    local_2d0.m_log = (TestLog *)*plVar6;
  }
  local_2c8 = plVar6[1];
  *plVar6 = (long)pTVar1;
  plVar6[1] = 0;
  *(undefined1 *)&pTVar1->m_log = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0.field_2._8_8_ = plVar6[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *psVar7;
    local_2b0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2b0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar8) {
    local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_1a0[0]._8_8_ = plVar6[3];
    local_1b0 = (undefined1  [8])local_1a0;
  }
  else {
    local_1a0[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_1b0 = (undefined1  [8])*plVar6;
  }
  local_1a8 = (_func_int **)plVar6[1];
  *plVar6 = (long)paVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::ResultCollector::fail(&local_210,(string *)local_1b0);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0.m_log != &local_2c0) {
    operator_delete(local_2d0.m_log,(ulong)((long)&(local_2c0.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
LAB_013dc17f:
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_21c,&local_210);
  if (bVar2) {
    bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      (&local_228,&local_210);
    if (bVar2) {
      bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        (&local_234,&local_210);
      if (bVar2) {
        iVar5 = local_228.m_value * local_21c.m_value;
        iVar3 = iVar5 + 3;
        if (-1 < iVar5) {
          iVar3 = iVar5;
        }
        iVar3 = (iVar3 >> 2) + local_234.m_value;
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_210,&local_250,0x8a32,iVar3,QUERY_INTEGER);
        pTVar1 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
        local_1b0 = (undefined1  [8])local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Types","");
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b0,"Alternative queries","");
        tcu::ScopedLogSection::ScopedLogSection(&local_2d0,pTVar1,(string *)local_1b0,&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if (local_1b0 != (undefined1  [8])local_1a0) {
          operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
        }
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_210,&local_250,0x8a32,iVar3,QUERY_BOOLEAN);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_210,&local_250,0x8a32,iVar3,QUERY_INTEGER64);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin
                  (&local_210,&local_250,0x8a32,iVar3,QUERY_FLOAT);
        tcu::TestLog::endSection(local_2d0.m_log);
      }
    }
  }
  tcu::ResultCollector::setTestContextResult
            (&local_210,
             (this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_prefix._M_dataplus._M_p != &local_210.m_prefix.field_2) {
    operator_delete(local_210.m_prefix._M_dataplus._M_p,
                    local_210.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_250);
  return STOP;
}

Assistant:

CombinedGeometryUniformLimitCase::IterateResult CombinedGeometryUniformLimitCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS is MAX_GEOMETRY_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_GEOMETRY_UNIFORM_COMPONENTS"
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(GL_MAX_GEOMETRY_UNIFORM_BLOCKS, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(GL_MAX_GEOMETRY_UNIFORM_COMPONENTS, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
	{
		const int limit = ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents;
		verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_INTEGER);

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_BOOLEAN);
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_INTEGER64);
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}